

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::contains(UnicodeSet *this,UChar32 start,UChar32 end)

{
  uint uVar1;
  bool local_1d;
  int32_t i;
  UChar32 end_local;
  UChar32 start_local;
  UnicodeSet *this_local;
  
  uVar1 = findCodePoint(this,start);
  local_1d = false;
  if ((uVar1 & 1) != 0) {
    local_1d = end < this->list[(int)uVar1];
  }
  return local_1d;
}

Assistant:

UBool UnicodeSet::contains(UChar32 start, UChar32 end) const {
    //int32_t i = -1;
    //for (;;) {
    //    if (start < list[++i]) break;
    //}
    int32_t i = findCodePoint(start);
    return ((i & 1) != 0 && end < list[i]);
}